

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O1

void __thiscall
QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test::TestBody
          (QueryTests_DeleteFrom_canDetermineSpecificationForDeleteFrom_Test *this)

{
  size_type *psVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppVar4;
  bool bVar5;
  int iVar6;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  *this_00;
  char *in_R9;
  long *plVar7;
  long lVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_01;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_03;
  AssertionResult gtest_ar__5;
  api_filter_type filter2;
  AssertionResult gtest_ar_;
  api_filter_type filter1;
  Query query_delete_from2;
  Query query_delete_from1;
  allocator_type local_3cc;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3cb;
  allocator_type local_3ca;
  allocator_type local_3c9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_3c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
  local_3a0;
  long *local_378 [2];
  long local_368 [2];
  undefined4 local_358;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
  local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_2b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_280;
  undefined1 local_268 [36];
  TransactionType local_244;
  _Alloc_hider local_240;
  pointer local_238;
  _Alloc_hider local_220;
  size_type local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
  local_188;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_158;
  Query local_140;
  
  database::Query::Query(&local_140,"delete from company.employee where employee_id = 1");
  psVar1 = &local_320.first._M_string_length;
  local_320.first._M_dataplus._M_p._0_1_ = local_140.m_transaction_type == delete_from;
  local_320.first._M_string_length = 0;
  if (local_140.m_transaction_type == delete_from) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    psVar1 = &local_320.first._M_string_length;
    local_320.first._M_dataplus._M_p._0_1_ = local_140.m_transaction_metatype == dml;
    local_320.first._M_string_length = 0;
    if (local_140.m_transaction_metatype == dml) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pcVar2 = local_268 + 0x10;
      local_268._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,local_140.m_database_name._M_dataplus._M_p,
                 local_140.m_database_name._M_dataplus._M_p +
                 local_140.m_database_name._M_string_length);
      iVar6 = std::__cxx11::string::compare(local_268);
      local_320.first._M_dataplus._M_p._0_1_ = iVar6 == 0;
      local_320.first._M_string_length = 0;
      if ((char *)local_268._0_8_ != pcVar2) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      psVar1 = &local_320.first._M_string_length;
      if ((char)local_320.first._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_3a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_268,(internal *)&local_320,
                   (AssertionResult *)"query_delete_from1.databaseName() == \"company\"","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_2b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                   ,0xd9,(char *)local_268._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&local_3a0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
        if ((char *)local_268._0_8_ != pcVar2) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
        if ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_3a0.first._M_dataplus._M_p + 8))();
          }
          local_3a0.first._M_dataplus._M_p = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_268._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,local_140.m_container_name._M_dataplus._M_p,
                   local_140.m_container_name._M_dataplus._M_p +
                   local_140.m_container_name._M_string_length);
        iVar6 = std::__cxx11::string::compare(local_268);
        local_320.first._M_dataplus._M_p._0_1_ = iVar6 == 0;
        local_320.first._M_string_length = 0;
        if ((char *)local_268._0_8_ != pcVar2) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
        psVar1 = &local_320.first._M_string_length;
        if ((char)local_320.first._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_3a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_268,(internal *)&local_320,
                     (AssertionResult *)"query_delete_from1.containerName() == \"employee\"","false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_2b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0xda,(char *)local_268._0_8_);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_2b0,(Message *)&local_3a0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
          if ((char *)local_268._0_8_ != pcVar2) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          if ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) && ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_3a0.first._M_dataplus._M_p + 8))();
            }
            local_3a0.first._M_dataplus._M_p = (pointer)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          paVar3 = &local_320.first.field_2;
          local_320.first._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"1","");
          local_320.second.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_320;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    *)&local_3a0,__l,(allocator_type *)&local_350);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      *)local_268,(char (*) [12])"employee_id",
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      *)&local_3a0);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_268;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                 *)&local_2b0,__l_00,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3c8,(allocator_type *)&local_280);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)(local_268 + 0x20));
          if ((char *)local_268._0_8_ != pcVar2) {
            operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)&local_3a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320.first._M_dataplus._M_p != paVar3) {
            operator_delete(local_320.first._M_dataplus._M_p,
                            local_320.first.field_2._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      *)local_268,&local_140.m_filter._M_t);
          if (local_240._M_p == (pointer)local_2b0._M_impl.super__Rb_tree_header._M_node_count) {
            bVar5 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>
                              ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                )local_268._24_8_,(_Base_ptr)(local_268 + 8),
                               (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                )local_2b0._M_impl.super__Rb_tree_header._M_header._M_left);
          }
          else {
            bVar5 = false;
          }
          psVar1 = &local_320.first._M_string_length;
          local_320.first._M_dataplus._M_p._0_1_ = bVar5;
          local_320.first._M_string_length = 0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                       *)local_268);
          if ((char)local_320.first._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_3a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_268,(internal *)&local_320,
                       (AssertionResult *)"query_delete_from1.filter() == filter1","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_350,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0xde,(char *)local_268._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_350,(Message *)&local_3a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_350);
            if ((char *)local_268._0_8_ != pcVar2) {
              operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
            }
            if ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0)) {
                (**(code **)(*(long *)local_3a0.first._M_dataplus._M_p + 8))();
              }
              local_3a0.first._M_dataplus._M_p = (pointer)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)psVar1,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)psVar1,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            database::Query::Query
                      ((Query *)local_268,
                       "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212"
                      );
            psVar1 = &local_3a0.first._M_string_length;
            local_3a0.first._M_dataplus._M_p._0_1_ = local_244 == delete_from;
            local_3a0.first._M_string_length = 0;
            if (local_244 == delete_from) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)psVar1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              psVar1 = &local_3a0.first._M_string_length;
              local_3a0.first._M_dataplus._M_p._0_1_ = local_268._32_4_ == dml;
              local_3a0.first._M_string_length = 0;
              if (local_268._32_4_ == dml) {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar1,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_320.first._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_320,local_240._M_p,
                           local_240._M_p + (long)&local_238->first);
                iVar6 = std::__cxx11::string::compare((char *)&local_320);
                local_3a0.first._M_dataplus._M_p._0_1_ = iVar6 == 0;
                local_3a0.first._M_string_length = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320.first._M_dataplus._M_p != paVar3) {
                  operator_delete(local_320.first._M_dataplus._M_p,
                                  local_320.first.field_2._M_allocated_capacity + 1);
                }
                psVar1 = &local_3a0.first._M_string_length;
                if ((char)local_3a0.first._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_350);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_320.first,(internal *)&local_3a0,
                             (AssertionResult *)"query_delete_from2.databaseName() == \"company\"",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_3c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                             ,0xe3,local_320.first._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_3c8,(Message *)&local_350);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320.first._M_dataplus._M_p != paVar3) {
                    operator_delete(local_320.first._M_dataplus._M_p,
                                    local_320.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((long *)local_350._M_impl._0_8_ != (long *)0x0) {
                    bVar5 = testing::internal::IsTrue(true);
                    if ((bVar5) && ((long *)local_350._M_impl._0_8_ != (long *)0x0)) {
                      (**(code **)(*(long *)local_350._M_impl._0_8_ + 8))();
                    }
                    local_350._M_impl._0_8_ = (long *)0x0;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar1,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar1,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_320.first._M_dataplus._M_p = (pointer)paVar3;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_320,local_220._M_p,local_220._M_p + local_218);
                  iVar6 = std::__cxx11::string::compare((char *)&local_320);
                  local_3a0.first._M_dataplus._M_p._0_1_ = iVar6 == 0;
                  local_3a0.first._M_string_length = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320.first._M_dataplus._M_p != paVar3) {
                    operator_delete(local_320.first._M_dataplus._M_p,
                                    local_320.first.field_2._M_allocated_capacity + 1);
                  }
                  psVar1 = &local_3a0.first._M_string_length;
                  if ((char)local_3a0.first._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_350);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_320.first,(internal *)&local_3a0,
                               (AssertionResult *)
                               "query_delete_from2.containerName() == \"employee\"","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_3c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                               ,0xe4,local_320.first._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_3c8,(Message *)&local_350);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_320.first._M_dataplus._M_p != paVar3) {
                      operator_delete(local_320.first._M_dataplus._M_p,
                                      local_320.first.field_2._M_allocated_capacity + 1);
                    }
                    if ((long *)local_350._M_impl._0_8_ != (long *)0x0) {
                      bVar5 = testing::internal::IsTrue(true);
                      if ((bVar5) && ((long *)local_350._M_impl._0_8_ != (long *)0x0)) {
                        (**(code **)(*(long *)local_350._M_impl._0_8_ + 8))();
                      }
                      local_350._M_impl._0_8_ = (long *)0x0;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)psVar1,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)psVar1,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_3c8.first._M_dataplus._M_p = (pointer)&local_3c8.first.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3c8,"fulltime","");
                    local_3c8.second = not_equal_to;
                    __l_01._M_len = 1;
                    __l_01._M_array = &local_3c8;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::vector(&local_280,__l_01,&local_3c9);
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                    ::pair<const_char_(&)[16],_true>
                              (&local_320,(char (*) [16])"employee_status",&local_280);
                    local_3a0.first._M_dataplus._M_p = (pointer)&local_3a0.first.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3a0,"20180223","");
                    local_3a0.second = greater_or_equal_to;
                    plVar7 = local_368;
                    local_378[0] = plVar7;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_378,"20190212","");
                    local_358 = 5;
                    __l_02._M_len = 2;
                    __l_02._M_array = &local_3a0;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::vector(&local_158,__l_02,&local_3ca);
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                    ::pair<const_char_(&)[19],_true>
                              (&local_2e8,(char (*) [19])"employee_join_date",&local_158);
                    __l_03._M_len = 2;
                    __l_03._M_array = &local_320;
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                           *)&local_350,__l_03,&local_3cb,&local_3cc);
                    lVar8 = -0x70;
                    this_00 = &local_2e8.second;
                    do {
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(this_00);
                      ppVar4 = this_00[-2].
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      if ((pointer)((long)(this_00 + -1) + 8) != ppVar4) {
                        operator_delete(ppVar4,(ulong)((long)&(((pointer)
                                                               ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)((long)(this_00 + -1) + 8))->
                                                  _M_allocated_capacity)->first)._M_dataplus._M_p +
                                                  1));
                      }
                      this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                                 *)&this_00[-3].
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      lVar8 = lVar8 + 0x38;
                    } while (lVar8 != 0);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::~vector(&local_158);
                    lVar8 = -0x50;
                    do {
                      if (plVar7 != (long *)plVar7[-2]) {
                        operator_delete((long *)plVar7[-2],*plVar7 + 1);
                      }
                      plVar7 = plVar7 + -5;
                      lVar8 = lVar8 + 0x28;
                    } while (lVar8 != 0);
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    ::~vector(&local_280);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3c8.first._M_dataplus._M_p != &local_3c8.first.field_2) {
                      operator_delete(local_3c8.first._M_dataplus._M_p,
                                      local_3c8.first.field_2._M_allocated_capacity + 1);
                    }
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                *)&local_320,&local_188);
                    if (local_320.second.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        (pointer)local_350._M_impl.super__Rb_tree_header._M_node_count) {
                      bVar5 = std::__equal<false>::
                              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::vector<std::pair<std::__cxx11::string,database::ComparisonType>,std::allocator<std::pair<std::__cxx11::string,database::ComparisonType>>>>>>
                                        ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                          )local_320.first.field_2._8_8_,
                                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                          )&local_320.first._M_string_length,
                                         (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
                                          )local_350._M_impl.super__Rb_tree_header._M_header._M_left
                                        );
                    }
                    else {
                      bVar5 = false;
                    }
                    local_3a0.first._M_dataplus._M_p._0_1_ = bVar5;
                    local_3a0.first._M_string_length = 0;
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                 *)&local_320);
                    if ((char)local_3a0.first._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_3c8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_320.first,(internal *)&local_3a0,
                                 (AssertionResult *)"query_delete_from2.filter() == filter2","false"
                                 ,"true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_280,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xe9,local_320.first._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_280,(Message *)&local_3c8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_320.first._M_dataplus._M_p != paVar3) {
                        operator_delete(local_320.first._M_dataplus._M_p,
                                        local_320.first.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3c8.first._M_dataplus._M_p !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        bVar5 = testing::internal::IsTrue(true);
                        if ((bVar5) &&
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3c8.first._M_dataplus._M_p !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0)) {
                          (**(code **)(*(size_type *)local_3c8.first._M_dataplus._M_p + 8))();
                        }
                        local_3c8.first._M_dataplus._M_p = (pointer)0x0;
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_3a0.first._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                    ::~_Rb_tree(&local_350);
                  }
                }
              }
              else {
                testing::Message::Message((Message *)&local_350);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_320.first,(internal *)&local_3a0,
                           (AssertionResult *)
                           "query_delete_from2.transactionMetaType() == database::dml","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_3c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0xe2,local_320.first._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_3c8,(Message *)&local_350);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320.first._M_dataplus._M_p != paVar3) {
                  operator_delete(local_320.first._M_dataplus._M_p,
                                  local_320.first.field_2._M_allocated_capacity + 1);
                }
                if ((long *)local_350._M_impl._0_8_ != (long *)0x0) {
                  bVar5 = testing::internal::IsTrue(true);
                  if ((bVar5) && ((long *)local_350._M_impl._0_8_ != (long *)0x0)) {
                    (**(code **)(*(long *)local_350._M_impl._0_8_ + 8))();
                  }
                  local_350._M_impl._0_8_ = (long *)0x0;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar1,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
            }
            else {
              testing::Message::Message((Message *)&local_350);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_320.first,(internal *)&local_3a0,
                         (AssertionResult *)
                         "query_delete_from2.transactionType() == database::delete_from","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_3c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0xe1,local_320.first._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_3c8,(Message *)&local_350);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320.first._M_dataplus._M_p != paVar3) {
                operator_delete(local_320.first._M_dataplus._M_p,
                                local_320.first.field_2._M_allocated_capacity + 1);
              }
              if ((long *)local_350._M_impl._0_8_ != (long *)0x0) {
                bVar5 = testing::internal::IsTrue(true);
                if ((bVar5) && ((long *)local_350._M_impl._0_8_ != (long *)0x0)) {
                  (**(code **)(*(long *)local_350._M_impl._0_8_ + 8))();
                }
                local_350._M_impl._0_8_ = (long *)0x0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)psVar1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            database::Query::~Query((Query *)local_268);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree(&local_2b0);
        }
      }
    }
    else {
      testing::Message::Message((Message *)&local_3a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_268,(internal *)&local_320,
                 (AssertionResult *)"query_delete_from1.transactionMetaType() == database::dml",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xd8,(char *)local_268._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&local_3a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      if ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0) {
        bVar5 = testing::internal::IsTrue(true);
        if ((bVar5) && ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0)) {
          (**(code **)(*(long *)local_3a0.first._M_dataplus._M_p + 8))();
        }
        local_3a0.first._M_dataplus._M_p = (pointer)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_268,(internal *)&local_320,
               (AssertionResult *)"query_delete_from1.transactionType() == database::delete_from",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xd7,(char *)local_268._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    if ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)local_3a0.first._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_3a0.first._M_dataplus._M_p + 8))();
      }
      local_3a0.first._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)psVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  database::Query::~Query(&local_140);
  return;
}

Assistant:

TEST(QueryTests_DeleteFrom,canDetermineSpecificationForDeleteFrom)
{
  database::Query query_delete_from1 = "delete from company.employee where employee_id = 1";
  ASSERT_TRUE(query_delete_from1.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from1.databaseName() == "company");
  ASSERT_TRUE(query_delete_from1.containerName() == "employee");
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_delete_from1.filter() == filter1);

  database::Query query_delete_from2 = "delete from company.employee where employee_status <> fulltime and employee_join_date >= 20180223 and employee_join_date < 20190212";
  ASSERT_TRUE(query_delete_from2.transactionType() == database::delete_from);
  ASSERT_TRUE(query_delete_from2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_delete_from2.databaseName() == "company");
  ASSERT_TRUE(query_delete_from2.containerName() == "employee");
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::not_equal_to}}},
    {"employee_join_date",{{"20180223",database::greater_or_equal_to},{"20190212",database::lesser_than}}}
  };
  ASSERT_TRUE(query_delete_from2.filter() == filter2);
}